

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardMazeBuilder.cpp
# Opt level: O2

void __thiscall StandardMazeBuilder::BuildDoor(StandardMazeBuilder *this,int n1,int n2)

{
  Direction DVar1;
  StandardMazeBuilder *r1;
  Room *r2;
  StandardMazeBuilder *pSVar2;
  
  r1 = (StandardMazeBuilder *)Maze::RoomNo((int)this->_currentMaze);
  r2 = (Room *)Maze::RoomNo((int)this->_currentMaze);
  pSVar2 = (StandardMazeBuilder *)operator_new(0x18);
  Door::Door((Door *)pSVar2,(Room *)r1,r2);
  DVar1 = CommonWall(pSVar2,(Room *)r1,r2);
  pSVar2 = r1;
  Room::SetSide((Direction)r1,(MapSite *)(ulong)DVar1);
  DVar1 = CommonWall(pSVar2,r2,(Room *)r1);
  Room::SetSide((Direction)r2,(MapSite *)(ulong)DVar1);
  return;
}

Assistant:

void StandardMazeBuilder::BuildDoor (int n1, int n2) {
    Room* r1 = _currentMaze->RoomNo(n1);
    Room* r2 = _currentMaze->RoomNo(n2);
    Door* d = new Door(r1, r2);

    r1->SetSide(CommonWall(r1,r2), d);
    r2->SetSide(CommonWall(r2,r1), d);
}